

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-active.c
# Opt level: O0

int run_test_active(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 local_a8 [8];
  uv_timer_t timer;
  int r;
  
  puVar2 = uv_default_loop();
  timer.start_id._4_4_ = uv_timer_init(puVar2,(uv_timer_t *)local_a8);
  if (timer.start_id._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-active.c"
            ,0x30,"r == 0");
    abort();
  }
  iVar1 = uv_is_active((uv_handle_t *)local_a8);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-active.c"
            ,0x33,"0 == uv_is_active((uv_handle_t*) &timer)");
    abort();
  }
  iVar1 = uv_is_closing((uv_handle_t *)local_a8);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-active.c"
            ,0x34,"0 == uv_is_closing((uv_handle_t*) &timer)");
    abort();
  }
  timer.start_id._4_4_ = uv_timer_start((uv_timer_t *)local_a8,timer_cb,1000,0);
  if (timer.start_id._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-active.c"
            ,0x37,"r == 0");
    abort();
  }
  iVar1 = uv_is_active((uv_handle_t *)local_a8);
  if (iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-active.c"
            ,0x39,"1 == uv_is_active((uv_handle_t*) &timer)");
    abort();
  }
  iVar1 = uv_is_closing((uv_handle_t *)local_a8);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-active.c"
            ,0x3a,"0 == uv_is_closing((uv_handle_t*) &timer)");
    abort();
  }
  timer.start_id._4_4_ = uv_timer_stop((uv_timer_t *)local_a8);
  if (timer.start_id._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-active.c"
            ,0x3d,"r == 0");
    abort();
  }
  iVar1 = uv_is_active((uv_handle_t *)local_a8);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-active.c"
            ,0x3f,"0 == uv_is_active((uv_handle_t*) &timer)");
    abort();
  }
  iVar1 = uv_is_closing((uv_handle_t *)local_a8);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-active.c"
            ,0x40,"0 == uv_is_closing((uv_handle_t*) &timer)");
    abort();
  }
  timer.start_id._4_4_ = uv_timer_start((uv_timer_t *)local_a8,timer_cb,1000,0);
  if (timer.start_id._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-active.c"
            ,0x43,"r == 0");
    abort();
  }
  iVar1 = uv_is_active((uv_handle_t *)local_a8);
  if (iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-active.c"
            ,0x45,"1 == uv_is_active((uv_handle_t*) &timer)");
    abort();
  }
  iVar1 = uv_is_closing((uv_handle_t *)local_a8);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-active.c"
            ,0x46,"0 == uv_is_closing((uv_handle_t*) &timer)");
    abort();
  }
  uv_close((uv_handle_t *)local_a8,close_cb);
  iVar1 = uv_is_active((uv_handle_t *)local_a8);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-active.c"
            ,0x4a,"0 == uv_is_active((uv_handle_t*) &timer)");
    abort();
  }
  iVar1 = uv_is_closing((uv_handle_t *)local_a8);
  if (iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-active.c"
            ,0x4b,"1 == uv_is_closing((uv_handle_t*) &timer)");
    abort();
  }
  puVar2 = uv_default_loop();
  timer.start_id._4_4_ = uv_run(puVar2,UV_RUN_DEFAULT);
  if (timer.start_id._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-active.c"
            ,0x4e,"r == 0");
    abort();
  }
  if (close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-active.c"
            ,0x50,"close_cb_called == 1");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-active.c"
            ,0x52,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(active) {
  int r;
  uv_timer_t timer;

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT(r == 0);

  /* uv_is_active() and uv_is_closing() should always return either 0 or 1. */
  ASSERT(0 == uv_is_active((uv_handle_t*) &timer));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &timer));

  r = uv_timer_start(&timer, timer_cb, 1000, 0);
  ASSERT(r == 0);

  ASSERT(1 == uv_is_active((uv_handle_t*) &timer));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &timer));

  r = uv_timer_stop(&timer);
  ASSERT(r == 0);

  ASSERT(0 == uv_is_active((uv_handle_t*) &timer));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &timer));

  r = uv_timer_start(&timer, timer_cb, 1000, 0);
  ASSERT(r == 0);

  ASSERT(1 == uv_is_active((uv_handle_t*) &timer));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &timer));

  uv_close((uv_handle_t*) &timer, close_cb);

  ASSERT(0 == uv_is_active((uv_handle_t*) &timer));
  ASSERT(1 == uv_is_closing((uv_handle_t*) &timer));

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}